

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<19UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,9ul,1ul,6ul,1ul>
          (cx_string<19UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<9UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<6UL> *strings_4,cx_string<1UL> *strings_5)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 local_98;
  undefined7 uStack_90;
  undefined4 uStack_89;
  char buffer [20];
  long lStack_38;
  mserialize *local_30;
  cx_string<1UL> *local_28;
  cx_string<1UL> *local_20;
  cx_string<9UL> *local_18;
  cx_string<1UL> *local_10;
  cx_string<6UL> *local_8;
  
  puVar3 = &local_98;
  local_98 = 0;
  uStack_90 = 0;
  uStack_89 = 0;
  local_30 = this;
  local_28 = strings;
  local_20 = strings_1;
  local_18 = strings_2;
  local_10 = strings_3;
  local_8 = strings_4;
  lVar1 = 1;
  stack0xffffffffffffff90 = 1;
  do {
    if (*(long *)(buffer + lVar1 * 8 + 8) != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_38)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < *(ulong *)(buffer + lVar1 * 8 + 8));
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  __return_storage_ptr__->_data[0x13] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_98;
  *(ulong *)(__return_storage_ptr__->_data + 8) = CONCAT17((undefined1)uStack_89,uStack_90);
  *(undefined4 *)(__return_storage_ptr__->_data + 0xf) = uStack_89;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}